

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

void iSortDependencies(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,int *oGroup)

{
  Vec_Int_t *p;
  int *piVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar1 = (int *)malloc(0x40);
  p->pArray = piVar1;
  if (0 < pNtk->vPis->nSize) {
    lVar11 = 0;
    do {
      iVar13 = iDep[lVar11]->nSize;
      if (iVar13 != 1) {
        p_00 = (Vec_Int_t *)malloc(0x10);
        if (iVar13 - 1U < 0xf) {
          iVar13 = 0x10;
        }
        p_00->nSize = 0;
        p_00->nCap = iVar13;
        if (iVar13 == 0) {
          piVar1 = (int *)0x0;
        }
        else {
          piVar1 = (int *)malloc((long)iVar13 << 2);
        }
        p_00->pArray = piVar1;
        pVVar3 = iDep[lVar11];
        if (0 < pVVar3->nSize) {
          lVar14 = 0;
          do {
            if (0 < (long)p->nSize) {
              lVar5 = 0;
              do {
                if (p->pArray[lVar5] == oGroup[pVVar3->pArray[lVar14]]) goto LAB_0028cd17;
                lVar5 = lVar5 + 1;
              } while (p->nSize != lVar5);
            }
            Vec_IntPushOrder(p,oGroup[pVVar3->pArray[lVar14]]);
LAB_0028cd17:
            lVar14 = lVar14 + 1;
            pVVar3 = iDep[lVar11];
          } while (lVar14 < pVVar3->nSize);
        }
        uVar2 = (ulong)p->nSize;
        bVar17 = 0 < (long)uVar2;
        if (0 < (long)uVar2) {
          uVar12 = 0;
          do {
            pVVar3 = iDep[lVar11];
            if (0 < pVVar3->nSize) {
              uVar15 = 0;
              do {
                iVar13 = (int)uVar15;
                if ((iVar13 < 0) || (!bVar17)) {
LAB_0028ceca:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                if (oGroup[pVVar3->pArray[uVar15]] == p->pArray[uVar12]) {
                  Vec_IntPush(p_00,pVVar3->pArray[uVar15]);
                  pVVar3 = iDep[lVar11];
                  uVar4 = pVVar3->nSize;
                  if ((int)uVar4 <= iVar13) goto LAB_0028ceca;
                  piVar1 = pVVar3->pArray;
                  uVar7 = 0;
                  bVar16 = 0 < (int)uVar4;
                  if (0 < (int)uVar4) {
                    bVar16 = true;
                    if (*piVar1 != piVar1[uVar15]) {
                      uVar10 = 0;
                      do {
                        if ((ulong)uVar4 - 1 == uVar10) {
                          bVar16 = false;
                          uVar7 = (ulong)uVar4;
                          goto LAB_0028cde0;
                        }
                        uVar7 = uVar10 + 1;
                        lVar14 = uVar10 + 1;
                        uVar10 = uVar7;
                      } while (piVar1[lVar14] != piVar1[uVar15]);
                      bVar16 = uVar7 < uVar4;
                    }
                  }
LAB_0028cde0:
                  if ((uint)uVar7 != uVar4) {
                    if (!bVar16) {
                      __assert_fail("i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                    ,0x3e5,"int Vec_IntRemove(Vec_Int_t *, int)");
                    }
                    uVar8 = (uint)uVar7 + 1;
                    if ((int)uVar8 < (int)uVar4) {
                      piVar9 = piVar1 + uVar8;
                      do {
                        iVar6 = (int)uVar7;
                        piVar1[uVar7 & 0xffffffff] = *piVar9;
                        uVar4 = pVVar3->nSize;
                        piVar9 = piVar9 + 1;
                        uVar7 = (ulong)(iVar6 + 1);
                      } while (iVar6 + 2 < (int)uVar4);
                    }
                    pVVar3->nSize = uVar4 - 1;
                  }
                  iVar13 = iVar13 + -1;
                }
                uVar15 = (ulong)(iVar13 + 1U);
                pVVar3 = iDep[lVar11];
              } while ((int)(iVar13 + 1U) < pVVar3->nSize);
            }
            uVar12 = uVar12 + 1;
            bVar17 = uVar12 < uVar2;
          } while (uVar12 != uVar2);
        }
        pVVar3 = iDep[lVar11];
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pVVar3->pArray = (int *)0x0;
        }
        if (pVVar3 != (Vec_Int_t *)0x0) {
          free(pVVar3);
        }
        iDep[lVar11] = p_00;
        p->nSize = 0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pNtk->vPis->nSize);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup)
{
    int i, j, k;    
    Vec_Int_t * temp;    
    Vec_Int_t * oGroupList;    

    oGroupList = Vec_IntAlloc( 10 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
    {
        if(Vec_IntSize(iDep[i]) == 1)
            continue;
        
        temp = Vec_IntAlloc( Vec_IntSize(iDep[i]) );        

        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            Vec_IntPushUniqueOrder(oGroupList, oGroup[Vec_IntEntry(iDep[i], j)]);

        for(j = 0; j < Vec_IntSize(oGroupList); j++)
        {
            for(k = 0; k < Vec_IntSize(iDep[i]); k++)
                if(oGroup[Vec_IntEntry(iDep[i], k)] == Vec_IntEntry(oGroupList, j))
                {
                    Vec_IntPush( temp, Vec_IntEntry(iDep[i], k) );        
                    Vec_IntRemove( iDep[i], Vec_IntEntry(iDep[i], k) );
                    k--;
                }
        }        

        Vec_IntFree( iDep[i] );        
        iDep[i] = temp;
        Vec_IntClear( oGroupList );

        /*printf("Input %d: ", i);
        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            printf("%d ", Vec_IntEntry(iDep[i], j));
        printf("\n");*/
    }
    
    Vec_IntFree( oGroupList );
}